

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int mbedtls_cipher_crypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *input,size_t ilen,
              uchar *output,size_t *olen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = mbedtls_cipher_set_iv(ctx,iv,iv_len);
  if (iVar3 == 0) {
    if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
      iVar3 = -0x6100;
    }
    else {
      ctx->unprocessed_len = 0;
      iVar3 = mbedtls_cipher_update(ctx,input,ilen,output,olen);
      if (iVar3 == 0) {
        if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
          iVar3 = -0x6100;
        }
        else {
          uVar2 = *(uint *)&ctx->cipher_info->field_0x8;
          uVar4 = uVar2 >> 0xc & 0xf;
          uVar1 = uVar4 - 3;
          if (uVar1 < 8) {
            if ((uVar2 & 0xfe0000) == 0x4c0000) {
              return 0;
            }
            if ((0xdfU >> ((byte)uVar1 & 0x1f) & 1) != 0) {
              return 0;
            }
          }
          else if ((uVar2 & 0xfe0000) == 0x4c0000) {
            return 0;
          }
          iVar3 = -0x6080;
          if (uVar4 == 1) {
            iVar3 = -0x6280;
            if (ctx->unprocessed_len == 0) {
              iVar3 = 0;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_cipher_crypt(mbedtls_cipher_context_t *ctx,
                         const unsigned char *iv, size_t iv_len,
                         const unsigned char *input, size_t ilen,
                         unsigned char *output, size_t *olen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t finish_olen;

#if defined(MBEDTLS_USE_PSA_CRYPTO) && !defined(MBEDTLS_DEPRECATED_REMOVED)
    if (ctx->psa_enabled == 1) {
        /* As in the non-PSA case, we don't check that
         * a key has been set. If not, the key slot will
         * still be in its default state of 0, which is
         * guaranteed to be invalid, hence the PSA-call
         * below will gracefully fail. */
        mbedtls_cipher_context_psa * const cipher_psa =
            (mbedtls_cipher_context_psa *) ctx->cipher_ctx;

        psa_status_t status;
        psa_cipher_operation_t cipher_op = PSA_CIPHER_OPERATION_INIT;
        size_t part_len;

        if (ctx->operation == MBEDTLS_DECRYPT) {
            status = psa_cipher_decrypt_setup(&cipher_op,
                                              cipher_psa->slot,
                                              cipher_psa->alg);
        } else if (ctx->operation == MBEDTLS_ENCRYPT) {
            status = psa_cipher_encrypt_setup(&cipher_op,
                                              cipher_psa->slot,
                                              cipher_psa->alg);
        } else {
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
        }

        /* In the following, we can immediately return on an error,
         * because the PSA Crypto API guarantees that cipher operations
         * are terminated by unsuccessful calls to psa_cipher_update(),
         * and by any call to psa_cipher_finish(). */
        if (status != PSA_SUCCESS) {
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        }

        if (((mbedtls_cipher_mode_t) ctx->cipher_info->mode) != MBEDTLS_MODE_ECB) {
            status = psa_cipher_set_iv(&cipher_op, iv, iv_len);
            if (status != PSA_SUCCESS) {
                return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
            }
        }

        status = psa_cipher_update(&cipher_op,
                                   input, ilen,
                                   output, ilen, olen);
        if (status != PSA_SUCCESS) {
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        }

        status = psa_cipher_finish(&cipher_op,
                                   output + *olen, ilen - *olen,
                                   &part_len);
        if (status != PSA_SUCCESS) {
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        }

        *olen += part_len;
        return 0;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO && !MBEDTLS_DEPRECATED_REMOVED */

    if ((ret = mbedtls_cipher_set_iv(ctx, iv, iv_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_reset(ctx)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_update(ctx, input, ilen,
                                     output, olen)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_finish(ctx, output + *olen,
                                     &finish_olen)) != 0) {
        return ret;
    }

    *olen += finish_olen;

    return 0;
}